

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>>::
initialize<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>>
          (optional<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>> *this,
          Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *value)

{
  if (*this != (optional<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>>)0x1) {
    tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>::Animatable
              ((Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>, V = tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }